

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cpp
# Opt level: O0

void __thiscall
icu_63::StringPiece::StringPiece(StringPiece *this,StringPiece *x,int32_t pos,int32_t len)

{
  int local_20;
  int local_1c;
  int32_t len_local;
  int32_t pos_local;
  StringPiece *x_local;
  StringPiece *this_local;
  
  if (pos < 0) {
    local_1c = 0;
  }
  else {
    local_1c = pos;
    if (x->length_ < pos) {
      local_1c = x->length_;
    }
  }
  if (len < 0) {
    local_20 = 0;
  }
  else {
    local_20 = len;
    if (x->length_ - local_1c < len) {
      local_20 = x->length_ - local_1c;
    }
  }
  this->ptr_ = x->ptr_ + local_1c;
  this->length_ = local_20;
  return;
}

Assistant:

StringPiece::StringPiece(const StringPiece& x, int32_t pos, int32_t len) {
  if (pos < 0) {
    pos = 0;
  } else if (pos > x.length_) {
    pos = x.length_;
  }
  if (len < 0) {
    len = 0;
  } else if (len > x.length_ - pos) {
    len = x.length_ - pos;
  }
  ptr_ = x.ptr_ + pos;
  length_ = len;
}